

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O1

void __thiscall QBalloonTip::paintEvent(QBalloonTip *this,QPaintEvent *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  long in_FS_OFFSET;
  int iVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  QPainter painter;
  undefined1 local_60 [24];
  undefined1 local_48 [16];
  QPixmap local_38 [16];
  double local_28;
  double dStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_60,&(this->super_QWidget).super_QPaintDevice);
  pQVar5 = (this->super_QWidget).data;
  uVar1 = (pQVar5->crect).x2;
  uVar3 = (pQVar5->crect).y2;
  uVar2 = (pQVar5->crect).x1;
  uVar4 = (pQVar5->crect).y1;
  iVar8 = uVar1 - uVar2;
  auVar6._4_4_ = uVar3 - uVar4;
  local_38[0] = (QPixmap)0x0;
  local_38[1] = (QPixmap)0x0;
  local_38[2] = (QPixmap)0x0;
  local_38[3] = (QPixmap)0x0;
  local_38[4] = (QPixmap)0x0;
  local_38[5] = (QPixmap)0x0;
  local_38[6] = (QPixmap)0x0;
  local_38[7] = (QPixmap)0x0;
  local_38[8] = (QPixmap)0x0;
  local_38[9] = (QPixmap)0x0;
  local_38[10] = (QPixmap)0x0;
  local_38[0xb] = (QPixmap)0x0;
  local_38[0xc] = (QPixmap)0x0;
  local_38[0xd] = (QPixmap)0x0;
  local_38[0xe] = (QPixmap)0x0;
  local_38[0xf] = (QPixmap)0x0;
  auVar6._8_4_ = auVar6._4_4_;
  auVar6._12_4_ = -(uint)(auVar6._4_4_ < 0);
  auVar7._8_4_ = 0xffffffff;
  auVar7._0_8_ = 0xffffffffffffffff;
  auVar7._12_4_ = 0xffffffff;
  local_28 = (double)(CONCAT44(-(uint)(iVar8 < 0),iVar8) + 1);
  dStack_20 = (double)(auVar6._8_8_ - auVar7._8_8_);
  local_48 = (undefined1  [16])0x0;
  local_60._8_16_ = (undefined1  [16])0x0;
  QPainter::drawPixmap((QRectF *)local_60,local_38,(QRectF *)&this->pixmap);
  QPainter::~QPainter((QPainter *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBalloonTip::paintEvent(QPaintEvent *)
{
    QPainter painter(this);
    painter.drawPixmap(rect(), pixmap);
}